

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O3

void test_abs<long>(uint length)

{
  long *plVar1;
  undefined8 *puVar2;
  ulong uVar3;
  long lVar4;
  long *plVar5;
  ulong uVar6;
  shared_ptr<long> pv;
  
  uVar6 = (ulong)length;
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar3 = uVar6 * 8;
  }
  plVar1 = (long *)operator_new__(uVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<long*,void(*)(long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv,plVar1,nosimd::common::free<long>);
  if (0 < (int)length) {
    lVar4 = 0;
    plVar5 = plVar1;
    do {
      *plVar5 = lVar4;
      lVar4 = lVar4 + -1;
      plVar5 = plVar5 + 1;
    } while (-lVar4 != uVar6);
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        if (plVar1[uVar3] < 0) {
          plVar1[uVar3] = -plVar1[uVar3];
        }
        uVar3 = uVar3 + 1;
      } while (uVar6 != uVar3);
      if (0 < (int)length) {
        uVar3 = 0;
        do {
          if (0x8000000000000000 < (ulong)plVar1[uVar3]) {
            puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
            *puVar2 = "void test_abs(unsigned int) [T = long]";
            *(undefined4 *)(puVar2 + 1) = 0x81;
            *(uint *)((long)puVar2 + 0xc) = length;
            __cxa_throw(puVar2,&Exception::typeinfo,0);
          }
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
      }
    }
  }
  if (pv.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}